

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O2

Eci * __thiscall
libsgp4::SGP4::FindPositionSDP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  double dVar1;
  double dVar2;
  Eci *pEVar3;
  SatelliteException *this_00;
  double dVar4;
  double dVar5;
  double xinc_00;
  double dVar6;
  double omgadf;
  double xinc;
  double xnode;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  Eci *local_a0;
  double perturbed_cosio;
  double perturbed_sinio;
  double xmam;
  double em;
  double xmdf;
  DateTime local_70;
  double perturbed_aycof;
  double perturbed_xlcof;
  double perturbed_x7thm1;
  double perturbed_x1mth2;
  double perturbed_x3thm1;
  double xn;
  double local_38;
  
  xmdf = (this->common_consts_).xmdot * tsince + (this->elements_).mean_anomoly_;
  omgadf = (this->common_consts_).omgdot * tsince + (this->elements_).argument_perigee_;
  xnode = (this->common_consts_).xnodcf * tsince * tsince +
          (this->common_consts_).xnodot * tsince + (this->elements_).ascending_node_;
  dVar6 = (this->common_consts_).t2cof;
  local_b8 = (this->common_consts_).c1;
  dVar1 = (this->elements_).bstar_;
  dVar2 = (this->common_consts_).c4;
  xn = (this->elements_).recovered_mean_motion_;
  em = (this->elements_).eccentricity_;
  xinc = (this->elements_).inclination_;
  DeepSpaceSecular(tsince,&this->elements_,&this->common_consts_,&this->deepspace_consts_,
                   &this->integrator_params_,&xmdf,&omgadf,&xnode,&em,&xinc,&xn);
  if (xn <= 0.0) {
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (xn <= 0.0)");
  }
  else {
    dVar4 = pow(kXKE / xn,0.6666666666666666);
    local_38 = em - dVar1 * dVar2 * tsince;
    xmam = tsince * tsince * dVar6 * (this->elements_).recovered_mean_motion_ + xmdf;
    DeepSpacePeriodics(tsince,&this->deepspace_consts_,&local_38,&xinc,&omgadf,&xnode,&xmam);
    if (-0.001 < local_38) {
      dVar6 = 1e-06;
      if ((1e-06 <= local_38) && (dVar6 = local_38, 0.999999 < local_38)) {
        dVar6 = 0.999999;
      }
      dVar5 = -xinc;
      dVar1 = (double)(~-(ulong)(xinc < dVar5) & (ulong)omgadf |
                      (ulong)(omgadf + -3.141592653589793) & -(ulong)(xinc < dVar5));
      xinc_00 = xinc;
      dVar2 = xnode;
      if (xinc < dVar5) {
        xinc_00 = dVar5;
        dVar2 = xnode + 3.141592653589793;
      }
      local_a8 = xmam + dVar1 + dVar2;
      dVar5 = 1.0 - local_b8 * tsince;
      uStack_b0 = 0;
      local_b8 = dVar1;
      local_a0 = __return_storage_ptr__;
      RecomputeConstants(xinc_00,&perturbed_sinio,&perturbed_cosio,&perturbed_x3thm1,
                         &perturbed_x1mth2,&perturbed_x7thm1,&perturbed_xlcof,&perturbed_aycof);
      pEVar3 = local_a0;
      local_70.m_encoded = (long)(tsince * 60000000.0) + (this->elements_).epoch_.m_encoded;
      CalculateFinalPositionVelocity
                (local_a0,&local_70,dVar6,dVar4 * dVar5 * dVar5,local_b8,local_a8,dVar2,xinc_00,
                 perturbed_xlcof,perturbed_aycof,perturbed_x3thm1,perturbed_x1mth2,perturbed_x7thm1,
                 perturbed_cosio,perturbed_sinio);
      return pEVar3;
    }
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Error: (e <= -0.001)");
  }
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::FindPositionSDP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    double xinc;

    /*
     * update for secular gravity and atmospheric drag
     */
    double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    double xn = elements_.RecoveredMeanMotion();
    double em = elements_.Eccentricity();
    xinc = elements_.Inclination();

    DeepSpaceSecular(tsince,
                     elements_,
                     common_consts_,
                     deepspace_consts_,
                     integrator_params_,
                     xmdf,
                     omgadf,
                     xnode,
                     em,
                     xinc,
                     xn);

    if (xn <= 0.0)
    {
        throw SatelliteException("Error: (xn <= 0.0)");
    }

    a = pow(kXKE / xn, kTWOTHIRD) * tempa * tempa;
    e = em - tempe;
    double xmam = xmdf + elements_.RecoveredMeanMotion() * templ;

    DeepSpacePeriodics(tsince,
                       deepspace_consts_,
                       e,
                       xinc,
                       omgadf,
                       xnode,
                       xmam);

    /*
     * keeping xinc positive important unless you need to display xinc
     * and dislike negative inclinations
     */
    if (xinc < 0.0)
    {
        xinc = -xinc;
        xnode += kPI;
        omgadf -= kPI;
    }

    xl = xmam + omgadf + xnode;
    omega = omgadf;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * re-compute the perturbed values
     */
    double perturbed_sinio;
    double perturbed_cosio;
    double perturbed_x3thm1;
    double perturbed_x1mth2;
    double perturbed_x7thm1;
    double perturbed_xlcof;
    double perturbed_aycof;
    RecomputeConstants(xinc,
                       perturbed_sinio,
                       perturbed_cosio,
                       perturbed_x3thm1,
                       perturbed_x1mth2,
                       perturbed_x7thm1,
                       perturbed_xlcof,
                       perturbed_aycof);

    /*
     * using calculated values, find position and velocity
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          perturbed_xlcof,
                                          perturbed_aycof,
                                          perturbed_x3thm1,
                                          perturbed_x1mth2,
                                          perturbed_x7thm1,
                                          perturbed_cosio,
                                          perturbed_sinio);
}